

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O1

void xml_print_ns(lyout *out,lyd_node *node,int options)

{
  LYS_NODE LVar1;
  lys_node *plVar2;
  char *pcVar3;
  mlist *pmVar4;
  mlist *pmVar5;
  int iVar6;
  lys_module *plVar7;
  lyd_node *plVar8;
  lyd_node *plVar9;
  lyd_attr *plVar10;
  mlist *local_40;
  lyd_node *local_38;
  
  local_40 = (mlist *)0x0;
  if (out == (lyout *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_xml.c"
                  ,0x48,"void xml_print_ns(struct lyout *, const struct lyd_node *, int)");
  }
  local_38 = (lyd_node *)CONCAT44(local_38._4_4_,options);
  if (node == (lyd_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_xml.c"
                  ,0x49,"void xml_print_ns(struct lyout *, const struct lyd_node *, int)");
  }
  for (plVar10 = node->attr; plVar10 != (lyd_attr *)0x0; plVar10 = plVar10->next) {
    plVar2 = node->schema;
    iVar6 = strcmp(plVar2->name,"filter");
    if (iVar6 == 0) {
      pcVar3 = plVar2->module->name;
      iVar6 = strcmp(pcVar3,"ietf-netconf");
      if ((iVar6 != 0) && (iVar6 = strcmp(pcVar3,"notifications"), iVar6 != 0)) goto LAB_001977c8;
    }
    else {
LAB_001977c8:
      plVar7 = lys_main_module(plVar10->annotation->module);
      iVar6 = modlist_add(&local_40,plVar7);
      pmVar5 = local_40;
      if (iVar6 != 0) goto joined_r0x001979f9;
    }
  }
  plVar2 = node->schema;
  LVar1 = plVar2->nodetype;
  pmVar5 = local_40;
  if ((int)LVar1 < 0x10) {
    if (LVar1 != LYS_CONTAINER) {
      if ((((LVar1 == LYS_LEAF) || (LVar1 == LYS_LEAFLIST)) && (((ulong)local_38 & 0xc0) != 0)) &&
         (((node->field_0x9 & 1) != 0 &&
          (plVar7 = ly_ctx_get_module(plVar2->module->ctx,"ietf-netconf-with-defaults",(char *)0x0,1
                                     ), pmVar5 = local_40, plVar7 != (lys_module *)0x0)))) {
        modlist_add(&local_40,plVar7);
        pmVar5 = local_40;
      }
      goto joined_r0x001979f9;
    }
  }
  else if ((int)LVar1 < 0x100) {
    if ((LVar1 != LYS_LIST) && (LVar1 != LYS_NOTIF)) goto joined_r0x001979f9;
  }
  else if ((LVar1 != LYS_RPC) && (LVar1 != LYS_ACTION)) goto joined_r0x001979f9;
  if (((((ulong)local_38 & 0xc0) == 0) ||
      (plVar7 = ly_ctx_get_module(plVar2->module->ctx,"ietf-netconf-with-defaults",(char *)0x0,1),
      plVar7 == (lys_module *)0x0)) ||
     (iVar6 = modlist_add(&local_40,plVar7), pmVar5 = local_40, iVar6 == 0)) {
    plVar9 = node->child;
    while (local_38 = plVar9, pmVar5 = local_40, plVar9 != (lyd_node *)0x0) {
      do {
        for (plVar10 = plVar9->attr; plVar10 != (lyd_attr *)0x0; plVar10 = plVar10->next) {
          plVar2 = plVar9->schema;
          iVar6 = strcmp(plVar2->name,"filter");
          if (iVar6 == 0) {
            pcVar3 = plVar2->module->name;
            iVar6 = strcmp(pcVar3,"ietf-netconf");
            if ((iVar6 != 0) && (iVar6 = strcmp(pcVar3,"notifications"), iVar6 != 0))
            goto LAB_0019792c;
          }
          else {
LAB_0019792c:
            plVar7 = lys_main_module(plVar10->annotation->module);
            iVar6 = modlist_add(&local_40,plVar7);
            pmVar5 = local_40;
            if (iVar6 != 0) goto joined_r0x001979f9;
          }
        }
        if ((plVar9->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
          plVar8 = plVar9->child;
        }
        else {
          plVar8 = (lyd_node *)0x0;
        }
        if (plVar8 == (lyd_node *)0x0) {
          if (plVar9 == local_38) break;
          plVar8 = plVar9->next;
        }
        if (plVar8 == (lyd_node *)0x0) {
          for (plVar9 = plVar9->parent;
              (plVar9->parent != local_38->parent &&
              (plVar8 = plVar9->next, plVar8 == (lyd_node *)0x0)); plVar9 = plVar9->parent) {
          }
        }
        plVar9 = plVar8;
      } while (plVar8 != (lyd_node *)0x0);
      plVar9 = local_38->next;
    }
  }
joined_r0x001979f9:
  while (pmVar5 != (mlist *)0x0) {
    pmVar4 = pmVar5->next;
    ly_print(out," xmlns:%s=\"%s\"",pmVar5->module->prefix,pmVar5->module->ns);
    free(pmVar5);
    pmVar5 = pmVar4;
  }
  return;
}

Assistant:

static void
xml_print_ns(struct lyout *out, const struct lyd_node *node, int options)
{
    struct lyd_node *next, *cur, *node2;
    struct lyd_attr *attr;
    const struct lys_module *wdmod = NULL;
    struct mlist *mlist = NULL, *miter;
    int r;

    assert(out);
    assert(node);

    /* add node attribute modules */
    for (attr = node->attr; attr; attr = attr->next) {
        if (!strcmp(node->schema->name, "filter") &&
                (!strcmp(node->schema->module->name, "ietf-netconf") ||
                 !strcmp(node->schema->module->name, "notifications"))) {
            /* exception for NETCONF's filter attributes */
            continue;
        } else {
            r = modlist_add(&mlist, lys_main_module(attr->annotation->module));
        }
        if (r) {
            goto print;
        }
    }

    /* add node children nodes and attribute modules */
    switch (node->schema->nodetype) {
    case LYS_LEAFLIST:
    case LYS_LEAF:
        if (node->dflt && (options & (LYP_WD_ALL_TAG | LYP_WD_IMPL_TAG))) {
            /* get with-defaults module and print its namespace */
            wdmod = ly_ctx_get_module(node->schema->module->ctx, "ietf-netconf-with-defaults", NULL, 1);
            if (wdmod && modlist_add(&mlist, wdmod)) {
                goto print;
            }
        }
        break;
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_RPC:
    case LYS_ACTION:
    case LYS_NOTIF:
        if (options & (LYP_WD_ALL_TAG | LYP_WD_IMPL_TAG)) {
            /* get with-defaults module and print its namespace */
            wdmod = ly_ctx_get_module(node->schema->module->ctx, "ietf-netconf-with-defaults", NULL, 1);
            if (wdmod && modlist_add(&mlist, wdmod)) {
                goto print;
            }
        }

        LY_TREE_FOR(node->child, node2) {
            LY_TREE_DFS_BEGIN(node2, next, cur) {
                for (attr = cur->attr; attr; attr = attr->next) {
                    if (!strcmp(cur->schema->name, "filter") &&
                            (!strcmp(cur->schema->module->name, "ietf-netconf") ||
                             !strcmp(cur->schema->module->name, "notifications"))) {
                        /* exception for NETCONF's filter attributes */
                        continue;
                    } else {
                        r = modlist_add(&mlist, lys_main_module(attr->annotation->module));
                    }
                    if (r) {
                        goto print;
                    }
                }
            LY_TREE_DFS_END(node2, next, cur)}
        }
        break;
    default:
        break;
    }

print:
    /* print used namespaces */
    while (mlist) {
        miter = mlist;
        mlist = mlist->next;

        ly_print(out, " xmlns:%s=\"%s\"", miter->module->prefix, miter->module->ns);
        free(miter);
    }
}